

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O1

void * __thiscall rapidxml::memory_pool<char>::allocate_aligned(memory_pool<char> *this,size_t size)

{
  char *pcVar1;
  ulong uVar2;
  char *pcVar3;
  size_t size_00;
  
  pcVar1 = (char *)((ulong)(-(int)*(long *)(this + 8) & 7) + *(long *)(this + 8));
  if (*(char **)(this + 0x10) < pcVar1 + size) {
    size_00 = 0x10016;
    if (0x10000 < size) {
      size_00 = size + 0x16;
    }
    pcVar1 = allocate_raw(this,size_00);
    uVar2 = (ulong)(-(int)pcVar1 & 7);
    pcVar3 = pcVar1 + uVar2;
    *(undefined8 *)pcVar3 = *(undefined8 *)this;
    *(char **)this = pcVar1;
    *(char **)(this + 8) = pcVar3 + 8;
    *(char **)(this + 0x10) = pcVar1 + size_00;
    pcVar1 = pcVar1 + (-(int)(pcVar3 + 8) & 7) + uVar2 + 8;
  }
  *(char **)(this + 8) = pcVar1 + size;
  return pcVar1;
}

Assistant:

void *allocate_aligned(std::size_t size)
        {
            // Calculate aligned pointer
            char *result = align(m_ptr);

            // If not enough memory left in current pool, allocate a new pool
            if (result + size > m_end)
            {
                // Calculate required pool size (may be bigger than RAPIDXML_DYNAMIC_POOL_SIZE)
                std::size_t pool_size = RAPIDXML_DYNAMIC_POOL_SIZE;
                if (pool_size < size)
                    pool_size = size;
                
                // Allocate
                std::size_t alloc_size = sizeof(header) + (2 * RAPIDXML_ALIGNMENT - 2) + pool_size;     // 2 alignments required in worst case: one for header, one for actual allocation
                char *raw_memory = allocate_raw(alloc_size);
                    
                // Setup new pool in allocated memory
                char *pool = align(raw_memory);
                header *new_header = reinterpret_cast<header *>(pool);
                new_header->previous_begin = m_begin;
                m_begin = raw_memory;
                m_ptr = pool + sizeof(header);
                m_end = raw_memory + alloc_size;

                // Calculate aligned pointer again using new pool
                result = align(m_ptr);
            }

            // Update pool and return aligned pointer
            m_ptr = result + size;
            return result;
        }